

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Environmental_Process_PDU::ClearEnvironmentRecords(Environmental_Process_PDU *this)

{
  Environmental_Process_PDU *this_local;
  
  (this->super_Header).super_Header6.m_ui16PDULength = 0x20;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
  ::clear(&this->m_vEnvRecords);
  return;
}

Assistant:

void Environmental_Process_PDU::ClearEnvironmentRecords()
{
    // Reset the PDU length.
    m_ui16PDULength = ENVIROMENTAL_PROCESS_PDU_SIZE;
    m_vEnvRecords.clear();
}